

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::BeamData::Encode(BeamData *this,KDataStream *stream)

{
  KDataStream::Write<float>(stream,(float)this->m_f32AziCtr);
  KDataStream::Write<float>(stream,(float)this->m_f32AziSwp);
  KDataStream::Write<float>(stream,(float)this->m_f32EleCtr);
  KDataStream::Write<float>(stream,(float)this->m_f32EleSwp);
  KDataStream::Write<float>(stream,(float)this->m_f32SwpSyn);
  return;
}

Assistant:

void BeamData::Encode( KDataStream & stream ) const
{
    stream << m_f32AziCtr
           << m_f32AziSwp
           << m_f32EleCtr
           << m_f32EleSwp
           << m_f32SwpSyn;
}